

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O0

void coda_url_preunescape(char *s,char *dest,size_t sz)

{
  int iVar1;
  ulong uVar2;
  ulong in_RDX;
  long in_RSI;
  char *in_RDI;
  uint8_t c_1;
  char xnum_1 [3];
  uint8_t c;
  char xnum [3];
  size_t ptr;
  char local_27;
  char local_26;
  undefined1 local_25;
  undefined1 local_24;
  char local_23;
  char local_22;
  undefined1 local_21;
  ulong local_20;
  ulong local_18;
  long local_10;
  char *local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (*local_8 != '\0' && local_20 < local_18 + 5) {
    if (((*local_8 == '%') && (iVar1 = isxdigit((int)local_8[1]), iVar1 != 0)) &&
       (iVar1 = isxdigit((int)local_8[2]), iVar1 != 0)) {
      local_23 = local_8[1];
      local_22 = local_8[2];
      local_21 = 0;
      uVar2 = strtol(&local_23,(char **)0x0,0x10);
      local_24 = (undefined1)uVar2;
      if ((uVar2 & 0x80) == 0) {
        if (local_20 + 4 < local_18) {
          *(undefined2 *)(local_10 + local_20) = *(undefined2 *)local_8;
          *(char *)(local_10 + 2 + local_20) = local_8[2];
        }
        local_20 = local_20 + 3;
      }
      else {
        *(undefined1 *)(local_10 + local_20) = local_24;
        local_20 = local_20 + 1;
      }
      local_8 = local_8 + 3;
    }
    else if (((*local_8 == '\\') && (local_8[1] == 'x')) &&
            ((iVar1 = isxdigit((int)local_8[2]), iVar1 != 0 &&
             (iVar1 = isxdigit((int)local_8[3]), iVar1 != 0)))) {
      local_27 = local_8[2];
      local_26 = local_8[3];
      local_25 = 0;
      uVar2 = strtol(&local_27,(char **)0x0,0x10);
      if ((uVar2 & 0x80) == 0) {
        if (local_20 + 3 < local_18) {
          *(undefined4 *)(local_10 + local_20) = *(undefined4 *)local_8;
        }
      }
      else {
        *(char *)(local_10 + local_20) = (char)uVar2;
        local_20 = local_20 + 1;
      }
      local_8 = local_8 + 4;
    }
    else {
      *(char *)(local_10 + local_20) = *local_8;
      local_20 = local_20 + 1;
      local_8 = local_8 + 1;
    }
  }
  *(undefined1 *)(local_10 + local_20) = 0;
  return;
}

Assistant:

void coda_url_preunescape(const char* s, char* dest, size_t sz)
{
	size_t ptr = 0;
	while (*s && (ptr < sz + 5))
	{
		if ((*s == '%') && isxdigit(s[1]) && isxdigit(s[2]))
		{
			char xnum[3];
			xnum[0] = s[1];
			xnum[1] = s[2];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 4 < sz) memcpy(dest + ptr, s, 3);
				ptr += 3;
			}
			s += 3;
		}
		else if ((*s == '\\') && (s[1] == 'x') && isxdigit(s[2]) && isxdigit(s[3]))
		{
			char xnum[3];
			xnum[0] = s[2];
			xnum[1] = s[3];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 3 < sz) memcpy(dest + ptr, s, 4);
			}
			s += 4;
		}
		else
		{
			dest[ptr] = *s;
			ptr++;
			s++;
		}
	}
	dest[ptr] = 0;
}